

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BackwardPass.cpp
# Opt level: O1

void __thiscall
BackwardPass::InsertTypeTransitionAtBlock
          (BackwardPass *this,BasicBlock *block,int symId,AddPropertyCacheBucket *data,
          BVSparse<Memory::JitArenaAllocator> *upwardExposedUses)

{
  BasicBlock *pBVar1;
  Opnd *pOVar2;
  _func_int **pp_Var3;
  code *pcVar4;
  BasicBlock *pBVar5;
  bool bVar6;
  OpndKind OVar7;
  undefined4 *puVar8;
  Instr *pIVar9;
  JITType *pJVar10;
  _func_int **pp_Var11;
  Func **ppFVar12;
  Func **ppFVar13;
  long lVar14;
  long lVar15;
  Instr *this_00;
  Instr *pIVar16;
  bool bVar17;
  JITTypeHolderBase<void> local_70;
  JITTypeHolderBase<void> local_68;
  BasicBlock *local_60;
  Func **local_58;
  BVSparse<Memory::JitArenaAllocator> *local_50;
  BackwardPass *local_48;
  AddPropertyCacheBucket *local_40;
  int local_34;
  
  pBVar1 = block->next;
  local_58 = &block->func;
  ppFVar13 = (Func **)&pBVar1->firstInstr;
  if (pBVar1 == (BasicBlock *)0x0) {
    ppFVar13 = local_58;
  }
  lVar14 = 0x18;
  if (pBVar1 == (BasicBlock *)0x0) {
    lVar14 = 0xd0;
  }
  lVar15 = 0x18;
  if (*(long *)((long)&(*ppFVar13)->m_alloc + lVar14) == 0) {
    pIVar16 = (Instr *)0x0;
  }
  else {
    ppFVar13 = (Func **)&pBVar1->firstInstr;
    if (pBVar1 == (BasicBlock *)0x0) {
      lVar15 = 0xd0;
      ppFVar13 = local_58;
    }
    pIVar16 = *(Instr **)(*(long *)((long)&(*ppFVar13)->m_alloc + lVar15) + 0x10);
  }
  this_00 = block->firstInstr;
  bVar17 = this_00 == pIVar16;
  local_60 = block;
  local_50 = upwardExposedUses;
  local_48 = this;
  local_40 = data;
  local_34 = symId;
  if (!bVar17) {
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    pIVar9 = (Instr *)0x0;
    do {
      if ((pIVar9 != (Instr *)0x0) && (pIVar9->m_next != this_00)) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar8 = 1;
        bVar6 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                           ,0x1787,
                           "(__prevInstrCheck == nullptr || __prevInstrCheck->m_next == instr)",
                           "Modifying instr list but not using EDITING iterator!");
        if (!bVar6) goto LAB_003ed8b9;
        *puVar8 = 0;
      }
      bVar6 = IR::Instr::IsRealInstr(this_00);
      if (bVar6) {
        if (this_00->m_opcode == AdjustObjType) {
          pOVar2 = this_00->m_src1;
          OVar7 = IR::Opnd::GetKind(pOVar2);
          if (OVar7 != OpndKindReg) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            *puVar8 = 1;
            bVar6 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                               ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
            if (!bVar6) goto LAB_003ed8b9;
            *puVar8 = 0;
          }
          if (*(int *)(pOVar2[1]._vptr_Opnd + 2) != local_34) goto LAB_003ed63e;
          pOVar2 = this_00->m_dst;
          OVar7 = IR::Opnd::GetKind(pOVar2);
          if (OVar7 != OpndKindAddr) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
            *puVar8 = 1;
            bVar6 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                               ,0x18e,"(this->IsAddrOpnd())","Bad call to AsAddrOpnd()");
            if (!bVar6) goto LAB_003ed8b9;
            *puVar8 = 0;
          }
          pp_Var3 = pOVar2[2]._vptr_Opnd;
          local_70.t = (local_40->finalType).t;
          pJVar10 = JITTypeHolderBase<void>::operator->(&local_70);
          pp_Var11 = (_func_int **)JITType::GetAddr(pJVar10);
          if (pp_Var11 == pp_Var3) {
            pOVar2 = this_00->m_src2;
            OVar7 = IR::Opnd::GetKind(pOVar2);
            if (OVar7 != OpndKindAddr) {
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
              *puVar8 = 1;
              bVar6 = Js::Throw::ReportAssert
                                ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                                 ,0x18e,"(this->IsAddrOpnd())","Bad call to AsAddrOpnd()");
              if (!bVar6) goto LAB_003ed8b9;
              *puVar8 = 0;
            }
            pp_Var3 = pOVar2[2]._vptr_Opnd;
            local_68.t = (local_40->initialType).t;
            pJVar10 = JITTypeHolderBase<void>::operator->(&local_68);
            pp_Var11 = (_func_int **)JITType::GetAddr(pJVar10);
            if (pp_Var11 == pp_Var3) goto LAB_003ed7de;
          }
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
          *puVar8 = 1;
          bVar6 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                             ,0x1794,
                             "((intptr_t)instr->GetDst()->AsAddrOpnd()->m_address == data->GetFinalType()->GetAddr() && (intptr_t)instr->GetSrc2()->AsAddrOpnd()->m_address == data->GetInitialType()->GetAddr())"
                             ,
                             "(intptr_t)instr->GetDst()->AsAddrOpnd()->m_address == data->GetFinalType()->GetAddr() && (intptr_t)instr->GetSrc2()->AsAddrOpnd()->m_address == data->GetInitialType()->GetAddr()"
                            );
          if (!bVar6) goto LAB_003ed8b9;
          *puVar8 = 0;
        }
        else {
          InsertTypeTransition(local_48,this_00,local_34,local_40,local_50);
        }
LAB_003ed7de:
        if (!bVar17) {
          return;
        }
        break;
      }
LAB_003ed63e:
      bVar17 = this_00->m_next == pIVar16;
      pIVar9 = this_00;
      this_00 = this_00->m_next;
    } while (!bVar17);
  }
  ppFVar13 = local_58;
  pBVar5 = local_60;
  pBVar1 = local_60->next;
  ppFVar12 = (Func **)&pBVar1->firstInstr;
  if (pBVar1 == (BasicBlock *)0x0) {
    ppFVar12 = local_58;
  }
  lVar15 = 0x18;
  lVar14 = 0x18;
  if (pBVar1 == (BasicBlock *)0x0) {
    lVar14 = 0xd0;
  }
  if (*(long *)(*(long *)((long)&(*ppFVar12)->m_alloc + lVar14) + 0x10) == 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar8 = 1;
    bVar17 = Js::Throw::ReportAssert
                       ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                        ,0x17a4,"(block->GetLastInstr()->m_next)","block->GetLastInstr()->m_next");
    if (!bVar17) {
LAB_003ed8b9:
      pcVar4 = (code *)invalidInstructionException();
      (*pcVar4)();
    }
    *puVar8 = 0;
  }
  ppFVar12 = (Func **)&pBVar5->next->firstInstr;
  if (pBVar5->next == (BasicBlock *)0x0) {
    lVar15 = 0xd0;
    ppFVar12 = ppFVar13;
  }
  InsertTypeTransition
            (local_48,*(Instr **)(*(long *)((long)&(*ppFVar12)->m_alloc + lVar15) + 0x10),local_34,
             local_40,local_50);
  return;
}

Assistant:

void
BackwardPass::InsertTypeTransitionAtBlock(BasicBlock *block, int symId, AddPropertyCacheBucket *data, BVSparse<JitArenaAllocator>* upwardExposedUses)
{
    bool inserted = false;
    FOREACH_INSTR_IN_BLOCK(instr, block)
    {
        if (instr->IsRealInstr())
        {
            // Check for pre-existing type transition. There may be more than one AdjustObjType here,
            // so look at them all.
            if (instr->m_opcode == Js::OpCode::AdjustObjType)
            {
                if (instr->GetSrc1()->AsRegOpnd()->m_sym->m_id == (SymID)symId)
                {
                    // This symbol already has a type transition at this point.
                    // It *must* be doing the same transition we're already trying to do.
                    Assert((intptr_t)instr->GetDst()->AsAddrOpnd()->m_address == data->GetFinalType()->GetAddr() &&
                           (intptr_t)instr->GetSrc2()->AsAddrOpnd()->m_address == data->GetInitialType()->GetAddr());
                    // Nothing to do.
                    return;
                }
            }
            else
            {
                this->InsertTypeTransition(instr, symId, data, upwardExposedUses);
                inserted = true;
                break;
            }
        }
    }
    NEXT_INSTR_IN_BLOCK;
    if (!inserted)
    {
        Assert(block->GetLastInstr()->m_next);
        this->InsertTypeTransition(block->GetLastInstr()->m_next, symId, data, upwardExposedUses);
    }
}